

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmOSXBundleGenerator.cxx
# Opt level: O2

void __thiscall
cmOSXBundleGenerator::CreateAppBundle(cmOSXBundleGenerator *this,string *targetName,string *outpath)

{
  bool bVar1;
  string plist;
  string newoutpath;
  string out;
  string local_40;
  
  bVar1 = MustSkip(this);
  if (!bVar1) {
    std::__cxx11::string::string((string *)&out,(string *)outpath);
    std::__cxx11::string::append((char *)&out);
    cmGeneratorTarget::GetAppBundleDirectory(&newoutpath,this->GT,&this->ConfigName,false);
    std::__cxx11::string::append((string *)&out);
    std::__cxx11::string::~string((string *)&newoutpath);
    cmsys::SystemTools::MakeDirectory(out._M_dataplus._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&out);
    std::__cxx11::string::string((string *)&newoutpath,(string *)&out);
    std::__cxx11::string::string((string *)&plist,(string *)outpath);
    std::__cxx11::string::append((char *)&plist);
    cmGeneratorTarget::GetAppBundleDirectory(&local_40,this->GT,&this->ConfigName,true);
    std::__cxx11::string::append((string *)&plist);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::append((char *)&plist);
    cmLocalGenerator::GenerateAppleInfoPList
              (this->LocalGenerator,this->GT,targetName,plist._M_dataplus._M_p);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(&this->Makefile->OutputFiles,&plist);
    std::__cxx11::string::_M_assign((string *)outpath);
    std::__cxx11::string::~string((string *)&plist);
    std::__cxx11::string::~string((string *)&newoutpath);
    std::__cxx11::string::~string((string *)&out);
  }
  return;
}

Assistant:

void cmOSXBundleGenerator::CreateAppBundle(const std::string& targetName,
                                           std::string& outpath)
{
  if (this->MustSkip())
    return;

  // Compute bundle directory names.
  std::string out = outpath;
  out += "/";
  out += this->GT->GetAppBundleDirectory(this->ConfigName, false);
  cmSystemTools::MakeDirectory(out.c_str());
  this->Makefile->AddCMakeOutputFile(out);

  std::string newoutpath = out;

  // Configure the Info.plist file.  Note that it needs the executable name
  // to be set.
  std::string plist = outpath;
  plist += "/";
  plist += this->GT->GetAppBundleDirectory(this->ConfigName, true);
  plist += "/Info.plist";
  this->LocalGenerator->GenerateAppleInfoPList(this->GT,
                                               targetName,
                                               plist.c_str());
  this->Makefile->AddCMakeOutputFile(plist);
  outpath = newoutpath;
}